

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O3

void __thiscall
gmlc::utilities::stringOps::trimString(stringOps *this,string *input,string_view whitespace)

{
  size_type sVar1;
  ulong uVar2;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                           ,(char *)whitespace._M_len,0xffffffffffffffff,(size_type)input);
  uVar2 = sVar1 + 1;
  if (uVar2 <= *(ulong *)(this + 8)) {
    *(ulong *)(this + 8) = uVar2;
    *(undefined1 *)(*(long *)this + uVar2) = 0;
    sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,(char *)whitespace._M_len,0,(size_type)input);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,0,sVar1);
    return;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar2);
}

Assistant:

void trimString(std::string& input, std::string_view whitespace)
    {
        input.erase(input.find_last_not_of(whitespace) + 1);
        input.erase(0, input.find_first_not_of(whitespace));
    }